

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

void __thiscall GrcSymbolTable::InitGlyphAttrs(GrcSymbolTable *this)

{
  Symbol pGVar1;
  int __val;
  allocator local_992;
  allocator local_991;
  GrcSymbolTable *local_990;
  string staLevel;
  GrcStructName local_968;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_990 = this;
  std::__cxx11::string::string((string *)&local_d0,"component",(allocator *)&local_968);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_d0);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_d0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_f0,"directionality",(allocator *)&local_968);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_f0);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_f0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_110,"breakweight",(allocator *)&local_968);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_110);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_110);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_130,"justify",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_150,"stretch",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_130,&local_150);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_170,"justify",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_190,"shrink",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_170,&local_190);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_1b0,"justify",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_1d0,"step",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_1b0,&local_1d0);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_1f0,"justify",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_210,"weight",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_1f0,&local_210);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  pGVar1->m_fGeneric = true;
  for (__val = 0; __val != 4; __val = __val + 1) {
    std::__cxx11::to_string(&staLevel,__val);
    std::__cxx11::string::string((string *)&local_230,"justify",&local_992);
    std::__cxx11::string::string((string *)&local_250,(string *)&staLevel);
    std::__cxx11::string::string((string *)&local_50,"stretch",&local_991);
    GrcStructName::GrcStructName(&local_968,&local_230,&local_250,&local_50);
    pGVar1 = FindSymbol(local_990,&local_968);
    pGVar1->m_symt2 = ksymtGlyphAttr;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_968.m_vstaFields);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_230);
    pGVar1->m_fGeneric = true;
    std::__cxx11::string::string((string *)&local_270,"justify",&local_992);
    std::__cxx11::string::string((string *)&local_290,(string *)&staLevel);
    std::__cxx11::string::string((string *)&local_70,"shrink",&local_991);
    GrcStructName::GrcStructName(&local_968,&local_270,&local_290,&local_70);
    pGVar1 = FindSymbol(local_990,&local_968);
    pGVar1->m_symt2 = ksymtGlyphAttr;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_968.m_vstaFields);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    pGVar1->m_fGeneric = true;
    std::__cxx11::string::string((string *)&local_2b0,"justify",&local_992);
    std::__cxx11::string::string((string *)&local_2d0,(string *)&staLevel);
    std::__cxx11::string::string((string *)&local_90,"step",&local_991);
    GrcStructName::GrcStructName(&local_968,&local_2b0,&local_2d0,&local_90);
    pGVar1 = FindSymbol(local_990,&local_968);
    pGVar1->m_symt2 = ksymtGlyphAttr;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_968.m_vstaFields);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    pGVar1->m_fGeneric = true;
    std::__cxx11::string::string((string *)&local_2f0,"justify",&local_992);
    std::__cxx11::string::string((string *)&local_310,(string *)&staLevel);
    std::__cxx11::string::string((string *)&local_b0,"weight",&local_991);
    GrcStructName::GrcStructName(&local_968,&local_2f0,&local_310,&local_b0);
    pGVar1 = FindSymbol(local_990,&local_968);
    pGVar1->m_symt2 = ksymtGlyphAttr;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_968.m_vstaFields);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    pGVar1->m_fGeneric = true;
    std::__cxx11::string::~string((string *)&staLevel);
  }
  std::__cxx11::string::string((string *)&local_330,"*actualForPseudo*",(allocator *)&local_968);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_330);
  pGVar1 = PreDefineSymbol(local_990,(GrcStructName *)&staLevel,ksymtGlyphAttr,kexptNumber,kprecNone
                          );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_330);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_350,"*skipPasses*",(allocator *)&local_968);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_350);
  pGVar1 = PreDefineSymbol(local_990,(GrcStructName *)&staLevel,ksymtGlyphAttr,kexptNumber,kprecNone
                          );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_350);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_370,"mirror",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_390,"glyph",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_370,&local_390);
  pGVar1 = PreDefineSymbol(local_990,(GrcStructName *)&staLevel,ksymtGlyphAttr,kexptGlyphID,
                           kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_3b0,"mirror",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_3d0,"isEncoded",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_3b0,&local_3d0);
  pGVar1 = PreDefineSymbol(local_990,(GrcStructName *)&staLevel,ksymtGlyphAttr,kexptBoolean,
                           kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_3f0,"collision",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_410,"flags",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_3f0,&local_410);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_430,"collision",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_450,"min",&local_992);
  std::__cxx11::string::string((string *)&local_470,"x",&local_991);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_430,&local_450,&local_470);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_490,"collision",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_4b0,"max",&local_992);
  std::__cxx11::string::string((string *)&local_4d0,"x",&local_991);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_490,&local_4b0,&local_4d0);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_490);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_4f0,"collision",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_510,"min",&local_992);
  std::__cxx11::string::string((string *)&local_530,"y",&local_991);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_4f0,&local_510,&local_530);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4f0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_550,"collision",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_570,"max",&local_992);
  std::__cxx11::string::string((string *)&local_590,"y",&local_991);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_550,&local_570,&local_590);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_550);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_5b0,"collision",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_5d0,"margin",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_5b0,&local_5d0);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5b0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_5f0,"collision",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_610,"marginweight",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_5f0,&local_610);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_5f0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_630,"sequence",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_650,"class",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_630,&local_650);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_670,"sequence",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_690,"proxClass",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_670,&local_690);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_670);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_6b0,"sequence",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_6d0,"order",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_6b0,&local_6d0);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_6b0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_6f0,"sequence",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_710,"above",&local_992);
  std::__cxx11::string::string((string *)&local_730,"xoffset",&local_991);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_6f0,&local_710,&local_730);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_6f0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_750,"sequence",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_770,"above",&local_992);
  std::__cxx11::string::string((string *)&local_790,"weight",&local_991);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_750,&local_770,&local_790);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_750);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_7b0,"sequence",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_7d0,"below",&local_992);
  std::__cxx11::string::string((string *)&local_7f0,"xlimit",&local_991);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_7b0,&local_7d0,&local_7f0);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_7b0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_810,"sequence",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_830,"below",&local_992);
  std::__cxx11::string::string((string *)&local_850,"weight",&local_991);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_810,&local_830,&local_850);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::~string((string *)&local_810);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_870,"sequence",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_890,"valign",&local_992);
  std::__cxx11::string::string((string *)&local_8b0,"height",&local_991);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_870,&local_890,&local_8b0);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_870);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_8d0,"sequence",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_8f0,"valign",&local_992);
  std::__cxx11::string::string((string *)&local_910,"weight",&local_991);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_8d0,&local_8f0,&local_910);
  pGVar1 = FindSymbol(local_990,(GrcStructName *)&staLevel);
  pGVar1->m_symt2 = ksymtGlyphAttr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_8d0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_930,"collision",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_950,"complexFit",&local_992);
  GrcStructName::GrcStructName((GrcStructName *)&staLevel,&local_930,&local_950);
  pGVar1 = PreDefineSymbol(local_990,(GrcStructName *)&staLevel,ksymtGlyphAttr,kexptNumber,kprecNone
                          );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staLevel);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_930);
  pGVar1->m_fGeneric = true;
  return;
}

Assistant:

void GrcSymbolTable::InitGlyphAttrs()
{
	//	These were first recorded as slot attributes:

	Symbol psym;
	psym = AddType2(GrcStructName("component"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("directionality"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("breakweight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;

	psym = AddType2(GrcStructName("justify", "stretch"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("justify", "shrink"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("justify", "step"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("justify", "weight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;

	for (int iLevel = 0; iLevel <= kMaxJustLevel; iLevel++)
	{
		auto staLevel = std::to_string(iLevel);
		psym = AddType2(GrcStructName("justify", staLevel, "stretch"), ksymtGlyphAttr);
		psym->m_fGeneric = true;
		psym = AddType2(GrcStructName("justify", staLevel, "shrink"), ksymtGlyphAttr);
		psym->m_fGeneric = true;
		psym = AddType2(GrcStructName("justify", staLevel, "step"), ksymtGlyphAttr);
		psym->m_fGeneric = true;
		psym = AddType2(GrcStructName("justify", staLevel, "weight"), ksymtGlyphAttr);
		psym->m_fGeneric = true;
	}

	//	A fake glyph attribute that is used to store the actual glyph ID for pseudo-glyphs.
	psym = PreDefineSymbol(GrcStructName("*actualForPseudo*"), ksymtGlyphAttr, kexptNumber);
	psym->m_fGeneric = true;

	//	A built-in glyph attribute that is hold the pass optimization flags (bitmap indicating
	//	the passes for which a glyph is not a key glyph).
	psym = PreDefineSymbol(GrcStructName("*skipPasses*"), ksymtGlyphAttr, kexptNumber);
	psym->m_fGeneric = true;

	// These are just glyph attributes. These two must be in this order and contiguous,
	// so that the internal IDs are assigned correctly.

	psym = PreDefineSymbol(GrcStructName("mirror", "glyph"), ksymtGlyphAttr, kexptGlyphID);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("mirror", "isEncoded"), ksymtGlyphAttr, kexptBoolean);
	psym->m_fGeneric = true;

	// Built-in glyph attributes that define how automatic collision fixing should work.
	psym = AddType2(GrcStructName("collision", "flags"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "min", "x"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "max", "x"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "min", "y"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "max", "y"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "margin"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "marginweight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	// Not defined as glyph attributes:
	//psym = AddType2(GrcStructName("collision", "exclude", "glyph"), ksymtGlyphAttr);
	//psym->m_fGeneric = true;
	//psym = AddType2(GrcStructName("collision", "exclude", "offset", "x"), ksymtGlyphAttr);
	//psym->m_fGeneric = true;
	//psym = AddType2(GrcStructName("collision", "exclude", "offset", "y"), ksymtGlyphAttr);
	//psym->m_fGeneric = true;

	psym = AddType2(GrcStructName("sequence", "class"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "proxClass"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "order"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "above", "xoffset"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "above", "weight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "below", "xlimit"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "below", "weight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "valign", "height"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "valign", "weight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	
	// This one is used by the compiler, but not stored in the font:
	psym = PreDefineSymbol(GrcStructName("collision", "complexFit"), ksymtGlyphAttr, kexptNumber);
	psym->m_fGeneric = true;
}